

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O3

st_quicly_sent_block_t * quicly_sentmap__new_block(quicly_sentmap_t *map)

{
  st_quicly_sent_block_t *psVar1;
  st_quicly_sent_block_t *psVar2;
  st_quicly_sent_block_t *psVar3;
  
  psVar2 = (st_quicly_sent_block_t *)malloc(0x218);
  if (psVar2 != (st_quicly_sent_block_t *)0x0) {
    psVar2->next = (st_quicly_sent_block_t *)0x0;
    psVar2->num_entries = 0;
    psVar2->next_insert_at = 0;
    psVar1 = map->tail;
    psVar3 = (st_quicly_sent_block_t *)&map->tail;
    if (psVar1 != (st_quicly_sent_block_t *)0x0) {
      psVar3 = psVar1;
    }
    psVar3->next = psVar2;
    (&map->head)[psVar1 != (st_quicly_sent_block_t *)0x0] = psVar2;
  }
  return psVar2;
}

Assistant:

struct st_quicly_sent_block_t *quicly_sentmap__new_block(quicly_sentmap_t *map)
{
    struct st_quicly_sent_block_t *block;

    if ((block = malloc(sizeof(*block))) == NULL)
        return NULL;

    block->next = NULL;
    block->num_entries = 0;
    block->next_insert_at = 0;
    if (map->tail != NULL) {
        map->tail->next = block;
        map->tail = block;
    } else {
        map->head = map->tail = block;
    }

    return block;
}